

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall
YAML::SingleDocParser::ParseAnchor(SingleDocParser *this,anchor_t *anchor,string *anchor_name)

{
  Token *pTVar1;
  mapped_type_conflict1 *pmVar2;
  Exception *this_00;
  mapped_type_conflict1 mVar3;
  string local_50;
  
  pTVar1 = Scanner::peek(this->m_scanner);
  if (*anchor == 0) {
    std::__cxx11::string::_M_assign((string *)anchor_name);
    if ((pTVar1->value)._M_string_length == 0) {
      mVar3 = 0;
    }
    else {
      mVar3 = this->m_curAnchor + 1;
      this->m_curAnchor = mVar3;
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->m_anchors,&pTVar1->value);
      *pmVar2 = mVar3;
    }
    *anchor = mVar3;
    Scanner::pop(this->m_scanner);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x40);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"cannot assign multiple anchors to the same node","");
  Exception::Exception(this_00,&pTVar1->mark,&local_50);
  *(undefined ***)this_00 = &PTR__BadFile_008779d0;
  __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

void SingleDocParser::ParseAnchor(anchor_t& anchor, std::string& anchor_name) {
  Token& token = m_scanner.peek();
  if (anchor)
    throw ParserException(token.mark, ErrorMsg::MULTIPLE_ANCHORS);

  anchor_name = token.value;
  anchor = RegisterAnchor(token.value);
  m_scanner.pop();
}